

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpLexer.cpp
# Opt level: O0

void __thiscall GrpLexer::mLIT_UHEX(GrpLexer *this,bool _createToken)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  byte in_SIL;
  long *in_RDI;
  int _cnt450;
  size_type _begin;
  RefToken _token;
  int _ttype;
  char *in_stack_fffffffffffffed0;
  long *plVar4;
  string *in_stack_fffffffffffffed8;
  ScannerException *in_stack_fffffffffffffee0;
  Token *in_stack_fffffffffffffee8;
  Token *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  RefCount<Token> *in_stack_ffffffffffffff00;
  string local_c8 [32];
  undefined1 local_a8 [14];
  undefined1 local_9a;
  allocator local_99;
  string local_98 [64];
  int local_58;
  allocator in_stack_ffffffffffffffbf;
  GrpLexer *in_stack_ffffffffffffffc0;
  RefCount<Token> local_18;
  int local_10;
  byte local_9;
  
  local_9 = in_SIL & 1;
  RefCount<Token>::RefCount
            (in_stack_ffffffffffffff00,
             (Token *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  std::__cxx11::string::length();
  local_10 = 0x1b;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffc0,"U+",(allocator *)&stack0xffffffffffffffbf);
  (**(code **)(*in_RDI + 0xb8))(in_RDI,&stack0xffffffffffffffc0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffbf);
  local_58 = 0;
  while( true ) {
    (**(code **)(*in_RDI + 0x90))(in_RDI,1);
    bVar1 = BitSet::member((BitSet *)in_stack_fffffffffffffed8,
                           (int)((ulong)in_stack_fffffffffffffed0 >> 0x20));
    if (!bVar1) break;
    mXDIGIT(in_stack_ffffffffffffffc0,(bool)in_stack_ffffffffffffffbf);
    local_58 = local_58 + 1;
  }
  if (0 < local_58) {
    if ((local_9 & 1) != 0) {
      in_stack_fffffffffffffef0 = RefCount::operator_cast_to_Token_((RefCount *)&local_18);
      in_stack_fffffffffffffee8 = RefCount::operator_cast_to_Token_((RefCount *)&nullToken);
      if ((in_stack_fffffffffffffef0 == in_stack_fffffffffffffee8) && (local_10 != -1)) {
        (**(code **)(*in_RDI + 0x98))(local_a8,in_RDI,local_10);
        RefCount<Token>::operator=
                  ((RefCount<Token> *)in_stack_fffffffffffffef0,
                   (RefCount<Token> *)in_stack_fffffffffffffee8);
        RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffee0);
        in_stack_fffffffffffffee0 = (ScannerException *)RefCount<Token>::operator->(&local_18);
        plVar4 = in_RDI + 1;
        std::__cxx11::string::length();
        std::__cxx11::string::substr((ulong)local_c8,(ulong)plVar4);
        (*(*(_func_int ***)&in_stack_fffffffffffffee0->super_ANTLRException)[6])
                  (in_stack_fffffffffffffee0,local_c8);
        std::__cxx11::string::~string(local_c8);
      }
    }
    RefCount<Token>::operator=
              ((RefCount<Token> *)in_stack_fffffffffffffef0,
               (RefCount<Token> *)in_stack_fffffffffffffee8);
    RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffee0);
    return;
  }
  local_9a = 1;
  uVar3 = __cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"no viable alt for char: ",&local_99);
  iVar2 = (**(code **)(*in_RDI + 0x90))(in_RDI,1);
  CharScanner::charName(iVar2);
  std::operator+(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  iVar2 = (int)((ulong)in_stack_fffffffffffffed0 >> 0x20);
  (**(code **)(*in_RDI + 0x78))();
  ScannerException::ScannerException(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,iVar2);
  local_9a = 0;
  __cxa_throw(uVar3,&ScannerException::typeinfo,ScannerException::~ScannerException);
}

Assistant:

void GrpLexer::mLIT_UHEX(bool _createToken) {
	int _ttype; RefToken _token; auto _begin=text.length();
	_ttype = LIT_UHEX;
	
	match("U+");
	{
	int _cnt450=0;
	do {
		if ((_tokenSet_3.member(LA(1)))) {
			mXDIGIT(false);
		}
		else {
			if ( _cnt450>=1 ) { goto _loop450; } else {throw ScannerException(std::string("no viable alt for char: ")+charName(LA(1)),getLine());}
		}
		
		_cnt450++;
	} while (true);
	_loop450:;
	}
	if ( _createToken && _token==nullToken && _ttype!=Token::SKIP ) {
	   _token = makeToken(_ttype);
	   _token->setText(text.substr(_begin, text.length()-_begin));
	}
	_returnToken = _token;
}